

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

int loop(uchar *pattern,uchar *string)

{
  ushort *puVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  ushort **ppuVar7;
  ushort uVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  byte local_160 [12];
  undefined4 local_154;
  undefined8 local_150;
  uchar charset [271];
  
  memset(charset,0,0x10f);
  do {
    bVar12 = *pattern;
    pbVar15 = pattern;
    if (bVar12 == 0x2a) {
      do {
        pattern = pbVar15;
        pbVar15 = pattern + 1;
      } while (pattern[1] == 0x2a);
      bVar12 = *string;
      if (pattern[1] == 0 && bVar12 == 0) {
        return 0;
      }
      iVar5 = loop(pattern + 1,string);
      if ((bVar12 == 0) || (iVar5 == 0)) {
        return (uint)(iVar5 != 0);
      }
    }
    else if (bVar12 == 0x3f) {
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (ulong)*string * 2 + 1) & 0x40) == 0) {
        return 2 - (uint)(*string == 0);
      }
LAB_00510e24:
      pattern = pattern + 1;
    }
    else if (bVar12 == 0x5b) {
      pbVar15 = pattern + 1;
      uVar6 = 0;
      local_154 = 0;
      bVar2 = false;
      uVar11 = 0;
      local_150 = string;
LAB_00510e6d:
      do {
      } while (4 < uVar6);
      bVar12 = *pbVar15;
      uVar13 = (ulong)bVar12;
      uVar14 = (ulong)bVar12;
      switch(uVar6) {
      case 0:
        ppuVar7 = __ctype_b_loc();
        puVar1 = *ppuVar7;
        if ((puVar1[uVar14] & 8) == 0) {
          switch(bVar12) {
          case 0x5b:
            if (pbVar15[1] == 0x3a) {
              local_160[8] = 0;
              local_160[9] = 0;
              local_160[0] = 0;
              local_160[1] = 0;
              local_160[2] = 0;
              local_160[3] = 0;
              local_160[4] = 0;
              local_160[5] = 0;
              local_160[6] = 0;
              local_160[7] = 0;
              lVar10 = 0;
              bVar3 = false;
              bVar2 = false;
              while (!bVar2) {
                if (lVar10 == 10) {
                  return 2;
                }
                bVar12 = pbVar15[lVar10 + 2];
                if (bVar3) {
                  bVar2 = true;
                  bVar3 = true;
                  if (bVar12 != 0x5d) {
                    return 2;
                  }
                }
                else if ((~puVar1[bVar12] & 0x600) == 0) {
                  local_160[lVar10] = bVar12;
                  bVar3 = false;
                  bVar2 = false;
                }
                else {
                  bVar2 = false;
                  bVar3 = true;
                  if (bVar12 != 0x3a) {
                    return 2;
                  }
                }
                lVar10 = lVar10 + 1;
              }
              iVar5 = bcmp(local_160,"digit",6);
              puVar9 = charset + 0x102;
              if (iVar5 != 0) {
                iVar5 = bcmp(local_160,"alnum",6);
                puVar9 = charset + 0x101;
                if (iVar5 != 0) {
                  iVar5 = bcmp(local_160,"alpha",6);
                  puVar9 = charset + 0x104;
                  if (iVar5 != 0) {
                    iVar5 = bcmp(local_160,"xdigit",7);
                    puVar9 = charset + 0x103;
                    if (iVar5 != 0) {
                      iVar5 = bcmp(local_160,"print",6);
                      puVar9 = charset + 0x105;
                      if (iVar5 != 0) {
                        iVar5 = bcmp(local_160,"graph",6);
                        puVar9 = charset + 0x108;
                        if (iVar5 != 0) {
                          iVar5 = bcmp(local_160,"space",6);
                          puVar9 = charset + 0x109;
                          if (iVar5 != 0) {
                            iVar5 = bcmp(local_160,"blank",6);
                            puVar9 = charset + 0x106;
                            if (iVar5 != 0) {
                              iVar5 = bcmp(local_160,"upper",6);
                              puVar9 = charset + 0x10a;
                              if (iVar5 != 0) {
                                iVar5 = bcmp(local_160,"lower",6);
                                puVar9 = charset + 0x107;
                                if (iVar5 != 0) {
                                  return 2;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pbVar15 = pbVar15 + lVar10 + 2;
              *puVar9 = '\x01';
            }
            else {
              pbVar15 = pbVar15 + 1;
              charset[uVar14] = '\x01';
            }
            break;
          case 0x5c:
            uVar11 = (ulong)pbVar15[1];
            if ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            charset[uVar11] = '\x01';
            pbVar15 = pbVar15 + 2;
            bVar2 = true;
            uVar6 = 1;
            goto LAB_00510e6d;
          case 0x5d:
            if (bVar2) goto LAB_0051132e;
            charset[uVar14] = '\x01';
            pbVar15 = pbVar15 + 1;
            bVar2 = true;
            uVar6 = 3;
            goto LAB_00510e6d;
          case 0x5e:
switchD_0051109f_caseD_5e:
            puVar9 = charset + uVar14;
            if (charset[0x100] == '\0') {
              puVar9 = charset + 0x100;
            }
            bVar3 = true;
            if (charset[0x100] == '\0') {
              bVar3 = bVar2;
            }
            if (bVar2) {
              puVar9 = charset + uVar14;
              bVar3 = bVar2;
            }
            *puVar9 = '\x01';
            bVar2 = bVar3;
            goto LAB_00510f56;
          default:
            if (bVar12 == 0x21) goto switchD_0051109f_caseD_5e;
            if (((bVar12 != 0x2a) && (bVar12 != 0x3f)) && (bVar12 == 0)) {
              return 2;
            }
            charset[uVar14] = '\x01';
            pbVar15 = pbVar15 + 1;
          }
          bVar2 = true;
          uVar6 = 0;
          goto LAB_00510e6d;
        }
        charset[uVar14] = '\x01';
        pbVar15 = pbVar15 + 1;
        bVar2 = true;
        uVar6 = 1;
        uVar11 = uVar13;
        goto LAB_00510e6d;
      case 1:
        uVar6 = 0;
        if (bVar12 == 0x5b) goto LAB_00510e6d;
        if (bVar12 == 0x2d) {
          charset[0x2d] = '\x01';
          pbVar15 = pbVar15 + 1;
          local_154 = 0x2d;
          uVar6 = 2;
          goto LAB_00510e6d;
        }
        ppuVar7 = __ctype_b_loc();
        if (((*ppuVar7)[uVar14] & 8) != 0) {
          charset[uVar14] = '\x01';
          pbVar15 = pbVar15 + 1;
          uVar6 = 1;
          goto LAB_00510e6d;
        }
        if (bVar12 == 0x5c) {
          if ((*(byte *)((long)*ppuVar7 + (ulong)pbVar15[1] * 2 + 1) & 0x40) == 0) {
            return 2;
          }
          charset[pbVar15[1]] = '\x01';
          pbVar15 = pbVar15 + 2;
          uVar6 = 1;
          goto LAB_00510e6d;
        }
        if (bVar12 != 0x5d) {
          return 2;
        }
LAB_0051132e:
        string = local_150;
        uVar11 = (ulong)*local_150;
        uVar4 = 1;
        if (charset[uVar11] == '\0') {
          if (charset[0x101] == '\0') {
            if (charset[0x104] == '\0') {
              if (charset[0x102] == '\0') {
                if (charset[0x103] == '\0') {
                  if (charset[0x105] == '\0') {
                    if (charset[0x109] == '\0') {
                      if (charset[0x10a] == '\0') {
                        if (charset[0x107] == '\0') {
                          if (charset[0x106] == '\0') {
                            if (charset[0x108] == '\0') {
                              uVar4 = 0;
                            }
                            else {
                              ppuVar7 = __ctype_b_loc();
                              uVar4 = (*ppuVar7)[uVar11] & 0x8000;
                              string = local_150;
                            }
                          }
                          else {
                            uVar4 = (ushort)(uVar11 == 9 || uVar11 == 0x20);
                          }
                        }
                        else {
                          ppuVar7 = __ctype_b_loc();
                          uVar4 = (*ppuVar7)[uVar11] & 0x200;
                        }
                      }
                      else {
                        ppuVar7 = __ctype_b_loc();
                        uVar4 = (*ppuVar7)[uVar11] & 0x100;
                      }
                    }
                    else {
                      ppuVar7 = __ctype_b_loc();
                      uVar4 = (*ppuVar7)[uVar11] & 0x2000;
                    }
                  }
                  else {
                    ppuVar7 = __ctype_b_loc();
                    uVar4 = (*ppuVar7)[uVar11] & 0x4000;
                  }
                }
                else {
                  ppuVar7 = __ctype_b_loc();
                  uVar4 = (*ppuVar7)[uVar11] & 0x1000;
                }
              }
              else {
                ppuVar7 = __ctype_b_loc();
                uVar4 = (*ppuVar7)[uVar11] & 0x800;
              }
            }
            else {
              ppuVar7 = __ctype_b_loc();
              uVar4 = (*ppuVar7)[uVar11] & 0x400;
            }
          }
          else {
            ppuVar7 = __ctype_b_loc();
            uVar4 = (*ppuVar7)[uVar11] & 8;
          }
        }
        uVar8 = (ushort)(uVar4 == 0);
        if (charset[0x100] == '\0') {
          uVar8 = uVar4;
        }
        if (uVar8 == 0) {
          return 1;
        }
        pattern = pbVar15 + 1;
        memset(charset,0,0x10f);
        break;
      case 2:
        if (bVar12 == 0x5c) {
          uVar13 = (ulong)pbVar15[1];
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + uVar13 * 2 + 1) & 0x40) == 0) {
            return 2;
          }
          pbVar15 = pbVar15 + 1;
        }
        if ((char)uVar13 == '\\') {
          uVar13 = (ulong)pbVar15[1];
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + uVar13 * 2 + 1) & 0x40) == 0) {
            return 2;
          }
          charset[uVar13] = '\x01';
          pbVar15 = pbVar15 + 2;
          uVar6 = 0;
        }
        else {
          uVar6 = 2;
          if ((int)uVar13 == 0x5d) goto LAB_0051132e;
        }
        if ((byte)uVar11 <= (byte)uVar13) {
          ppuVar7 = __ctype_b_loc();
          puVar1 = *ppuVar7;
          uVar4 = puVar1[uVar13];
          if ((((uVar4 >> 9 & 1) == 0) || ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 2) == 0)) &&
             (((uVar4 >> 0xb & 1) == 0 || ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 8) == 0)))) {
            if ((uVar4 >> 8 & 1) == 0) {
              return 2;
            }
            if ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 1) == 0) {
              return 2;
            }
          }
          charset[(byte)local_154] = '\0';
          bVar12 = (byte)uVar11 + 1;
          while (bVar12 <= (byte)uVar13) {
            bVar12 = bVar12 + 1;
            charset[(ulong)bVar12 - 1] = '\x01';
          }
          pbVar15 = pbVar15 + 1;
          uVar11 = (ulong)(byte)(bVar12 + 1);
          uVar6 = 0;
        }
        goto LAB_00510e6d;
      case 3:
        if (bVar12 != 0x5b) {
          if (bVar12 == 0) {
            return 2;
          }
          if (bVar12 != 0x5d) {
            ppuVar7 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar7 + uVar14 * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            goto LAB_00510f50;
          }
          goto LAB_0051132e;
        }
        charset[0x5b] = '\x01';
        pbVar15 = pbVar15 + 1;
        uVar6 = 4;
        goto LAB_00510e6d;
      case 4:
        if (bVar12 == 0x5d) goto LAB_0051132e;
LAB_00510f50:
        charset[uVar14] = '\x01';
LAB_00510f56:
        pbVar15 = pbVar15 + 1;
        uVar6 = 0;
        goto LAB_00510e6d;
      }
    }
    else {
      if (bVar12 != 0x5c) {
        if (bVar12 == 0) {
          return (uint)(*string != 0);
        }
        if (bVar12 != *string) {
          return 1;
        }
        goto LAB_00510e24;
      }
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (ulong)pattern[1] * 2 + 1) & 0x40) == 0) {
        return 2;
      }
      if (pattern[1] != *string) {
        return 1;
      }
      pattern = pattern + 2;
    }
    string = string + 1;
  } while( true );
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string)
{
  loop_state state = CURLFNM_LOOP_DEFAULT;
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };
  int rc = 0;

  for(;;) {
    switch(state) {
    case CURLFNM_LOOP_DEFAULT:
      if(*p == '*') {
        while(*(p+1) == '*') /* eliminate multiple stars */
          p++;
        if(*s == '\0' && *(p+1) == '\0')
          return CURL_FNMATCH_MATCH;
        rc = loop(p + 1, s); /* *.txt matches .txt <=> .txt matches .txt */
        if(rc == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
        if(*s) /* let the star eat up one character */
          s++;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '?') {
        if(ISPRINT(*s)) {
          s++;
          p++;
        }
        else if(*s == '\0')
          return CURL_FNMATCH_NOMATCH;
        else
          return CURL_FNMATCH_FAIL; /* cannot deal with other character */
      }
      else if(*p == '\0') {
        if(*s == '\0')
          return CURL_FNMATCH_MATCH;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '\\') {
        state = CURLFNM_LOOP_BACKSLASH;
        p++;
      }
      else if(*p == '[') {
        unsigned char *pp = p+1; /* cannot handle with pointer to register */
        if(setcharset(&pp, charset)) {
          int found = FALSE;
          if(charset[(unsigned int)*s])
            found = TRUE;
          else if(charset[CURLFNM_ALNUM])
            found = ISALNUM(*s);
          else if(charset[CURLFNM_ALPHA])
            found = ISALPHA(*s);
          else if(charset[CURLFNM_DIGIT])
            found = ISDIGIT(*s);
          else if(charset[CURLFNM_XDIGIT])
            found = ISXDIGIT(*s);
          else if(charset[CURLFNM_PRINT])
            found = ISPRINT(*s);
          else if(charset[CURLFNM_SPACE])
            found = ISSPACE(*s);
          else if(charset[CURLFNM_UPPER])
            found = ISUPPER(*s);
          else if(charset[CURLFNM_LOWER])
            found = ISLOWER(*s);
          else if(charset[CURLFNM_BLANK])
            found = ISBLANK(*s);
          else if(charset[CURLFNM_GRAPH])
            found = ISGRAPH(*s);

          if(charset[CURLFNM_NEGATE])
            found = !found;

          if(found) {
            p = pp+1;
            s++;
            memset(charset, 0, CURLFNM_CHSET_SIZE);
          }
          else
            return CURL_FNMATCH_NOMATCH;
        }
        else
          return CURL_FNMATCH_FAIL;
      }
      else {
        if(*p++ != *s++)
          return CURL_FNMATCH_NOMATCH;
      }
      break;
    case CURLFNM_LOOP_BACKSLASH:
      if(ISPRINT(*p)) {
        if(*p++ == *s++)
          state = CURLFNM_LOOP_DEFAULT;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else
        return CURL_FNMATCH_FAIL;
      break;
    }
  }
}